

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
          (DescriptorIndex<std::pair<const_void_*,_int>_> *this,FileDescriptorProto *file,
          pair<const_void_*,_int> value)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  LogMessage *pLVar5;
  ulong uVar6;
  DescriptorProto *pDVar7;
  EnumDescriptorProto *this_00;
  FieldDescriptorProto *pFVar8;
  ServiceDescriptorProto *this_01;
  pair<const_void_*,_int> value_00;
  pair<const_void_*,_int> value_01;
  pair<const_void_*,_int> value_02;
  pair<const_void_*,_int> value_03;
  pair<const_void_*,_int> value_04;
  pair<const_void_*,_int> value_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  int local_18c;
  DescriptorIndex<std::pair<const_void_*,_int>_> *pDStack_188;
  int i_3;
  int iStack_180;
  DescriptorIndex<std::pair<const_void_*,_int>_> *local_178;
  int iStack_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  int local_13c;
  DescriptorIndex<std::pair<const_void_*,_int>_> *pDStack_138;
  int i_2;
  int iStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  int local_fc;
  DescriptorIndex<std::pair<const_void_*,_int>_> *pDStack_f8;
  int i_1;
  int iStack_f0;
  undefined4 local_dc;
  DescriptorIndex<std::pair<const_void_*,_int>_> *local_d8;
  int iStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  int local_9c;
  undefined1 local_98 [4];
  int i;
  string path;
  LogMessage local_68;
  FileDescriptorProto *local_30;
  FileDescriptorProto *file_local;
  DescriptorIndex<std::pair<const_void_*,_int>_> *this_local;
  pair<const_void_*,_int> value_local;
  
  this_local = (DescriptorIndex<std::pair<const_void_*,_int>_> *)value.first;
  value_local.first._0_4_ = value.second;
  local_30 = file;
  file_local = (FileDescriptorProto *)this;
  psVar4 = FileDescriptorProto::name_abi_cxx11_(file);
  bVar2 = InsertIfNotPresent<std::map<std::__cxx11::string,std::pair<void_const*,int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<void_const*,int>>>>,std::__cxx11::string,std::pair<void_const*,int>>
                    (&this->by_name_,psVar4,(pair<const_void_*,_int> *)&this_local);
  if (bVar2) {
    bVar2 = FileDescriptorProto::has_package(local_30);
    if (bVar2) {
      psVar4 = FileDescriptorProto::package_abi_cxx11_(local_30);
      std::__cxx11::string::string((string *)local_98,(string *)psVar4);
    }
    else {
      std::__cxx11::string::string((string *)local_98);
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_98,'.');
    }
    local_9c = 0;
    while( true ) {
      iVar1 = local_9c;
      iVar3 = FileDescriptorProto::message_type_size(local_30);
      if (iVar3 <= iVar1) break;
      pDVar7 = FileDescriptorProto::message_type(local_30,local_9c);
      psVar4 = DescriptorProto::name_abi_cxx11_(pDVar7);
      std::operator+(&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     psVar4);
      local_d8 = this_local;
      iStack_d0 = (int)value_local.first;
      value_00.second = (int)value_local.first;
      value_00.first = this_local;
      value_00._12_4_ = 0;
      bVar2 = AddSymbol(this,&local_c0,value_00);
      std::__cxx11::string::~string((string *)&local_c0);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        value_local._15_1_ = 0;
        goto LAB_00315758;
      }
      pDVar7 = FileDescriptorProto::message_type(local_30,local_9c);
      pDStack_f8 = this_local;
      iStack_f0 = (int)value_local.first;
      value_01.second = (int)value_local.first;
      value_01.first = this_local;
      value_01._12_4_ = 0;
      bVar2 = AddNestedExtensions(this,pDVar7,value_01);
      if (!bVar2) {
        value_local._15_1_ = 0;
        goto LAB_00315758;
      }
      local_9c = local_9c + 1;
    }
    local_fc = 0;
    while( true ) {
      iVar1 = local_fc;
      iVar3 = FileDescriptorProto::enum_type_size(local_30);
      if (iVar3 <= iVar1) break;
      this_00 = FileDescriptorProto::enum_type(local_30,local_fc);
      psVar4 = EnumDescriptorProto::name_abi_cxx11_(this_00);
      std::operator+(&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     psVar4);
      pDStack_138 = this_local;
      iStack_130 = (int)value_local.first;
      value_02.second = (int)value_local.first;
      value_02.first = this_local;
      value_02._12_4_ = 0;
      bVar2 = AddSymbol(this,&local_120,value_02);
      std::__cxx11::string::~string((string *)&local_120);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        value_local._15_1_ = 0;
        goto LAB_00315758;
      }
      local_fc = local_fc + 1;
    }
    local_13c = 0;
    while( true ) {
      iVar1 = local_13c;
      iVar3 = FileDescriptorProto::extension_size(local_30);
      if (iVar3 <= iVar1) break;
      pFVar8 = FileDescriptorProto::extension(local_30,local_13c);
      psVar4 = FieldDescriptorProto::name_abi_cxx11_(pFVar8);
      std::operator+(&local_160,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     psVar4);
      local_178 = this_local;
      iStack_170 = (int)value_local.first;
      value_03.second = (int)value_local.first;
      value_03.first = this_local;
      value_03._12_4_ = 0;
      bVar2 = AddSymbol(this,&local_160,value_03);
      std::__cxx11::string::~string((string *)&local_160);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        value_local._15_1_ = 0;
        goto LAB_00315758;
      }
      pFVar8 = FileDescriptorProto::extension(local_30,local_13c);
      pDStack_188 = this_local;
      iStack_180 = (int)value_local.first;
      value_04.second = (int)value_local.first;
      value_04.first = this_local;
      value_04._12_4_ = 0;
      bVar2 = AddExtension(this,pFVar8,value_04);
      if (!bVar2) {
        value_local._15_1_ = 0;
        goto LAB_00315758;
      }
      local_13c = local_13c + 1;
    }
    local_18c = 0;
    while( true ) {
      iVar1 = local_18c;
      iVar3 = FileDescriptorProto::service_size(local_30);
      if (iVar3 <= iVar1) break;
      this_01 = FileDescriptorProto::service(local_30,local_18c);
      psVar4 = ServiceDescriptorProto::name_abi_cxx11_(this_01);
      std::operator+(&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     psVar4);
      value_05.second = (int)value_local.first;
      value_05.first = this_local;
      value_05._12_4_ = 0;
      bVar2 = AddSymbol(this,&local_1b0,value_05);
      std::__cxx11::string::~string((string *)&local_1b0);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        value_local._15_1_ = 0;
        goto LAB_00315758;
      }
      local_18c = local_18c + 1;
    }
    value_local._15_1_ = 1;
LAB_00315758:
    local_dc = 1;
    std::__cxx11::string::~string((string *)local_98);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor_database.cc"
               ,0x39);
    pLVar5 = internal::LogMessage::operator<<(&local_68,"File already exists in database: ");
    psVar4 = FileDescriptorProto::name_abi_cxx11_(local_30);
    pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar4);
    internal::LogFinisher::operator=((LogFinisher *)(path.field_2._M_local_buf + 0xb),pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
    value_local._15_1_ = 0;
  }
  return (bool)(value_local._15_1_ & 1);
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file,
    Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  string path = file.has_package() ? file.package() : string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.message_type(i), value)) return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}